

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void inputSwitchDirection(MatrixXd *X,MatrixXd *u)

{
  VectorXd temp2;
  VectorXd temp1;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffde8;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *this;
  Index i;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffe00;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_58;
  
  i = 0;
  this = &local_58;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(in_stack_fffffffffffffe00,0);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
             in_stack_fffffffffffffde8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(in_stack_fffffffffffffe00,i);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
             in_stack_fffffffffffffde8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(in_stack_fffffffffffffe00,i);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(in_stack_fffffffffffffe00,i);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::operator=
            (this,(Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
                  in_stack_fffffffffffffde8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(in_stack_fffffffffffffe00,i);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
            (this,in_stack_fffffffffffffde8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(in_stack_fffffffffffffe00,i);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(in_stack_fffffffffffffe00,i);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::operator=
            (this,(Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
                  in_stack_fffffffffffffde8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(in_stack_fffffffffffffe00,i);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
            (this,in_stack_fffffffffffffde8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x465712);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x46571f);
  return;
}

Assistant:

void inputSwitchDirection(Eigen::MatrixXd &X, Eigen::MatrixXd &u){
	Eigen::VectorXd temp1 = X.row(0);
	Eigen::VectorXd temp2 = u.row(0);
	X.row(0) = X.row(1);
	X.row(1) = temp1;
	u.row(0) = u.row(1);
	u.row(1) = temp2; 
}